

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          LogicalType *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  string *value;
  undefined8 uVar1;
  _Alloc_hider in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffef0;
  string local_e8 [32];
  string local_c8 [32];
  LogicalType local_a8;
  undefined1 local_88 [56];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffee0,(LogicalType *)param);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffef8,(string *)params);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffec8,(LogicalType *)params_1);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params_2._0_8_);
  ::std::__cxx11::string::string
            (local_c8,(string *)
                      params_2.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar1 = 0x18f8f93;
  ::std::__cxx11::string::string
            (local_e8,(string *)
                      params_2.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  params_2_00._M_string_length = (size_type)local_e8;
  params_2_00._M_dataplus._M_p = (pointer)local_c8;
  params_2_00.field_2._M_allocated_capacity = uVar1;
  params_2_00.field_2._8_8_ = in_stack_fffffffffffffec8._M_p;
  ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xfffffffffffffee0,(LogicalType *)&stack0xfffffffffffffef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffec8,&local_a8,params_2_00,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffef0);
  ::std::__cxx11::string::~string(local_e8);
  ::std::__cxx11::string::~string(local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffee0);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}